

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decode.c
# Opt level: O2

int m_id(aec_stream_conflict *strm)

{
  internal_state_conflict *piVar1;
  internal_state_conflict *piVar2;
  _func_int_aec_stream_ptr_conflict *UNRECOVERED_JUMPTABLE;
  uint32_t uVar3;
  uint uVar4;
  int iVar5;
  
  piVar1 = strm->state;
  if (strm->avail_in < (ulong)piVar1->in_blklen) {
    uVar3 = bits_ask(strm,piVar1->id_len);
    if (uVar3 == 0) {
      piVar1->mode = m_id;
      return 0;
    }
    piVar2 = strm->state;
    iVar5 = piVar2->bitp - piVar1->id_len;
    uVar4 = (uint)(piVar2->acc >> ((byte)iVar5 & 0x3f)) &
            (uint)(0xffffffffffffffff >> (-(char)piVar1->id_len & 0x3fU));
    piVar1->id = uVar4;
    piVar2->bitp = iVar5;
  }
  else {
    uVar4 = direct_get(strm,piVar1->id_len);
    piVar1->id = uVar4;
  }
  UNRECOVERED_JUMPTABLE = piVar1->id_table[(int)uVar4];
  piVar1->mode = UNRECOVERED_JUMPTABLE;
  iVar5 = (*UNRECOVERED_JUMPTABLE)(strm);
  return iVar5;
}

Assistant:

static inline int m_id(struct aec_stream *strm)
{
    struct internal_state *state = strm->state;
    if (strm->avail_in >= strm->state->in_blklen) {
        state->id = direct_get(strm, state->id_len);
    } else {
        if (bits_ask(strm, state->id_len) == 0) {
            state->mode = m_id;
            return M_EXIT;
        }
        state->id = bits_get(strm, state->id_len);
        bits_drop(strm, state->id_len);
    }
    state->mode = state->id_table[state->id];
    return(state->mode(strm));
}